

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  bool bVar1;
  ImFontAtlas *in_RDI;
  ImFontBuilderIO *builder_io;
  ImFontConfig *in_stack_00000098;
  ImFontAtlas *in_stack_000000a0;
  ImFontBuilderIO *local_10;
  
  if ((in_RDI->ConfigData).Size == 0) {
    AddFontDefault(in_stack_000000a0,in_stack_00000098);
  }
  local_10 = in_RDI->FontBuilderIO;
  if (local_10 == (ImFontBuilderIO *)0x0) {
    local_10 = ImFontAtlasGetBuilderForStbTruetype();
  }
  bVar1 = (*local_10->FontBuilder_Build)(in_RDI);
  return bVar1;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Default font is none are specified
    if (ConfigData.Size == 0)
        AddFontDefault();

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}